

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

int raviV_check_usertype(lua_State *L,TString *name,TValue *o)

{
  code cVar1;
  byte bVar2;
  ushort uVar3;
  lua_CFunction p_Var4;
  TString *pTVar5;
  GCObject *pGVar6;
  code *pcVar7;
  TValue *n;
  ushort uVar8;
  int iVar9;
  char *pcVar10;
  GCObject *pGVar11;
  
  uVar3 = o->tt_;
  uVar8 = uVar3 & 0x7f;
  pGVar11 = (GCObject *)0x0;
  if (uVar8 < 0x15) {
    if (uVar8 == 5) {
      if (uVar3 != 0x8005) {
        pcVar10 = "((((o))->tt_) == (((5) | (1 << 15))))";
LAB_0012a656:
        __assert_fail(pcVar10,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x4d3,"int raviV_check_usertype(lua_State *, TString *, const TValue *)");
      }
      if ((o->value_).f[8] != (_func_int_lua_State_ptr)0x5) {
        pcVar10 = "(((o)->value_).gc)->tt == 5";
        goto LAB_0012a656;
      }
      pcVar7 = (o->value_).f + 0x28;
    }
    else {
      if (uVar8 != 7) goto LAB_0012a4b7;
      if (uVar3 != 0x8007) {
        pcVar10 = "((((o))->tt_) == (((7) | (1 << 15))))";
LAB_0012a637:
        __assert_fail(pcVar10,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x4d6,"int raviV_check_usertype(lua_State *, TString *, const TValue *)");
      }
      if ((o->value_).f[8] != (_func_int_lua_State_ptr)0x7) {
        pcVar10 = "(((o)->value_).gc)->tt == 7";
        goto LAB_0012a637;
      }
      pcVar7 = (o->value_).f + 0x10;
    }
LAB_0012a4b4:
    pGVar11 = *(GCObject **)pcVar7;
  }
  else if ((uVar8 == 0x25) || (uVar8 == 0x15)) {
    if ((uVar3 != 0x8015) && (uVar3 != 0x8025)) {
      pcVar10 = 
      "(((((o))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((o))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
      ;
LAB_0012a60f:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x4d0,"int raviV_check_usertype(lua_State *, TString *, const TValue *)");
    }
    cVar1 = (o->value_).f[8];
    if ((cVar1 != (code)0x15) && (cVar1 != (code)0x25)) {
      pcVar10 = 
      "((((o)->value_).gc)->tt == ((5) | ((1) << 4)) || (((o)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      goto LAB_0012a60f;
    }
    pcVar7 = (o->value_).f + 0x38;
    goto LAB_0012a4b4;
  }
LAB_0012a4b7:
  iVar9 = 0;
  if (pGVar11 == (GCObject *)0x0) {
    return 0;
  }
  if ((L->l_G->l_registry).tt_ != 0x8005) {
    pcVar10 = "((((&(L->l_G)->l_registry))->tt_) == (((5) | (1 << 15))))";
LAB_0012a578:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x4de,"int raviV_check_usertype(lua_State *, TString *, const TValue *)");
  }
  p_Var4 = (L->l_G->l_registry).value_.f;
  if (p_Var4[8] != (_func_int_lua_State_ptr)0x5) {
    pcVar10 = "(((&(L->l_G)->l_registry)->value_).gc)->tt == 5";
    goto LAB_0012a578;
  }
  if (name->tt != '\x04') {
    __assert_fail("key->tt == ((4) | ((0) << 4))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                  ,0x5a,"const TValue *luaH_getshortstr(Table *, TString *)");
  }
  n = (TValue *)((ulong)(*(uint *)(p_Var4 + 0x38) & name->hash) * 0x20 + *(long *)(p_Var4 + 0x18));
  if ((((Node *)n)->i_key).nk.tt_ == 0x8004) {
    pTVar5 = (TString *)(((Node *)n)->i_key).nk.value_.gc;
    bVar2 = pTVar5->tt;
    if ((bVar2 & 0xf) != 4) {
      pcVar10 = "(((((k)->value_).gc)->tt) & 0x0F) == 4";
LAB_0012a5bf:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if (bVar2 != 4) {
      pcVar10 = 
      "((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
      ;
      goto LAB_0012a5bf;
    }
    if (pTVar5 == name) goto LAB_0012a53f;
  }
  if ((((Node *)n)->i_key).nk.next == 0) {
    n = &luaO_nilobject_;
  }
  else {
    n = luaH_getshortstr_continue(name,(Node *)n);
  }
LAB_0012a53f:
  if ((((Node *)n)->i_val).tt_ == 0x8005) {
    pGVar6 = (((Node *)n)->i_val).value_.gc;
    if (pGVar6->tt != '\x05') {
      __assert_fail("(((metatab)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x4e0,"int raviV_check_usertype(lua_State *, TString *, const TValue *)");
    }
    if (pGVar6 == pGVar11) {
      iVar9 = 1;
    }
  }
  return iVar9;
}

Assistant:

int raviV_check_usertype(lua_State *L, TString *name, const TValue *o)
{
  Table *mt;
  switch (ttype(o)) {
  case RAVI_TIARRAY:
  case RAVI_TFARRAY:
    mt = arrvalue(o)->metatable;
    break;
  case LUA_TTABLE:
    mt = hvalue(o)->metatable;
    break;
  case LUA_TUSERDATA:
    mt = uvalue(o)->metatable;
    break;
  default:
    mt = NULL;
  }
  if (mt == NULL)
    return 0;
  /* get global table from registry */
  Table *reg = hvalue(&G(L)->l_registry);
  const TValue *metatab = luaH_getshortstr(reg, name);
  return (!ttisnil(metatab) && ttisLtable(metatab) && hvalue(metatab) == mt) || 0;
}